

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcfs.c
# Opt level: O3

void arcfs_fixtime(Header *hdr)

{
  tm *ptVar1;
  uint uVar2;
  long local_10;
  
  uVar2 = (-0x33 - (uint)(hdr->exec < 0x6e996a00)) + (uint)(byte)hdr->load;
  local_10 = (ulong)((hdr->exec + 0x91669600) / 100 + uVar2 * 0x28f5c29) - (ulong)uVar2 / 0x19;
  ptVar1 = localtime(&local_10);
  hdr->date = (short)(ptVar1->tm_mon << 5) + 0x20U | (short)(ptVar1->tm_year << 9) + 0x6000U |
              (ushort)ptVar1->tm_mday;
  hdr->time = (ushort)((uint)(ptVar1->tm_sec - (ptVar1->tm_sec >> 0x1f)) >> 1) |
              (ushort)(ptVar1->tm_min << 5) | (ushort)(ptVar1->tm_hour << 0xb);
  return;
}

Assistant:

void
arcfs_fixtime(Header *hdr)
{
	/* BB next line commented out, variable ti never used */
	/* time_t ti; */
	struct tm *tim;

	/* Convert to UNIX time first (as it is easy) */
	tim = rotm(hdr->load, hdr->exec);

	/* Convert UNIX time to SPARK time */
	hdr->date = (tim->tm_year - 80) << 9;
	hdr->date |= (tim->tm_mon + 1) << 5;
	hdr->date |= (tim->tm_mday);
	hdr->time = (tim->tm_hour) << 11;
	hdr->time |= (tim->tm_min) << 5;
	hdr->time |= tim->tm_sec / 2;
}